

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_nodes.h
# Opt level: O0

void __thiscall spvtools::opt::SEMultiplyNode::~SEMultiplyNode(SEMultiplyNode *this)

{
  SEMultiplyNode *this_local;
  
  ~SEMultiplyNode(this);
  ::operator_delete(this,0x30);
  return;
}

Assistant:

explicit SEMultiplyNode(ScalarEvolutionAnalysis* parent_analysis)
      : SENode(parent_analysis) {}